

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldState.cpp
# Opt level: O1

void __thiscall AI::WorldState::popChanges(WorldState *this)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict mVar2;
  mapped_type mVar3;
  pointer pSVar4;
  mapped_type *pmVar5;
  mapped_type_conflict *pmVar6;
  _Base_ptr p_Var7;
  StateChanges *__p;
  map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  *__range1;
  map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_WorldStateIdentifier,_float>_>,_std::_Rb_tree_iterator<std::pair<const_WorldStateIdentifier,_float>_>_>
  pVar8;
  value_type poppedChanges;
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  local_f0;
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_float>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_float>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  local_c0;
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_Math::Vector3>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  local_90;
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  local_60;
  
  pSVar4 = (this->changes).super__Vector_base<AI::StateChanges,_std::allocator<AI::StateChanges>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  ::_Rb_tree(&local_f0,
             (_Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
              *)(pSVar4 + -1));
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_float>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_float>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  ::_Rb_tree(&local_c0,&pSVar4[-1].state.values._M_t);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_Math::Vector3>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  ::_Rb_tree(&local_90,&pSVar4[-1].state.vectors._M_t);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  ::_Rb_tree(&local_60,&pSVar4[-1].valuesAddedOrRemoved._M_t);
  __p = (this->changes).super__Vector_base<AI::StateChanges,_std::allocator<AI::StateChanges>_>.
        _M_impl.super__Vector_impl_data._M_finish + -1;
  (this->changes).super__Vector_base<AI::StateChanges,_std::allocator<AI::StateChanges>_>._M_impl.
  super__Vector_impl_data._M_finish = __p;
  __gnu_cxx::new_allocator<AI::StateChanges>::destroy<AI::StateChanges>
            ((new_allocator<AI::StateChanges> *)&this->changes,__p);
  for (; (_Rb_tree_header *)local_f0._M_impl.super__Rb_tree_header._M_header._M_left !=
         &local_f0._M_impl.super__Rb_tree_header;
      local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment(local_f0._M_impl.super__Rb_tree_header._M_header._M_left)) {
    mVar3 = (mapped_type)local_f0._M_impl.super__Rb_tree_header._M_header._M_left[1].field_0x4;
    pmVar5 = std::
             map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
             ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                           *)this,&local_f0._M_impl.super__Rb_tree_header._M_header._M_left[1].
                                   _M_color);
    *pmVar5 = mVar3;
  }
  p_Var1 = &local_c0._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_c0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    do {
      mVar2 = *(mapped_type_conflict *)
               &local_c0._M_impl.super__Rb_tree_header._M_header._M_left[1].field_0x4;
      pmVar6 = std::
               map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
               ::operator[](&(this->current).values,
                            &local_c0._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color);
      *pmVar6 = mVar2;
      local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment(local_c0._M_impl.super__Rb_tree_header._M_header._M_left);
    } while ((_Rb_tree_header *)local_c0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1);
  }
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    this_00 = &(this->current).values;
    p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if (p_Var7[1].field_0x4 == '\x01') {
        std::
        map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
        ::operator[](this_00,&p_Var7[1]._M_color);
      }
      else {
        pVar8 = std::
                _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_float>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_float>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
                ::equal_range(&this_00->_M_t,&p_Var7[1]._M_color);
        std::
        _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_float>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_float>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar8.first._M_node,(_Base_ptr)pVar8.second._M_node
                      );
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_Math::Vector3>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_float>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_float>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  ::~_Rb_tree(&local_f0);
  return;
}

Assistant:

void WorldState::popChanges()
	{
		auto poppedChanges = changes[changes.size() - 1];
		changes.pop_back();

		for (auto& flag : poppedChanges.state.flags)
		{
			current.flags[flag.first] = flag.second;
		}

		for (auto& value : poppedChanges.state.values)
		{
			current.values[value.first] = value.second;
		}

		for (auto& value : poppedChanges.valuesAddedOrRemoved)
		{
			if (value.second)
			{
				current.values[value.first];
			}
			else
			{
				current.values.erase(value.first);
			}
		}
	}